

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWInstaller.cxx
# Opt level: O3

void __thiscall cmCPackIFWInstaller::GeneratePackageFiles(cmCPackIFWInstaller *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  long *plVar5;
  _Rb_tree_node_base *p_Var6;
  long *plVar7;
  size_type *psVar8;
  string forcedOption;
  cmCPackIFWPackage package;
  string local_368;
  long *local_348;
  long local_340;
  long local_338;
  long lStack_330;
  string local_328;
  string local_308;
  cmCPackIFWPackage local_2e8;
  
  if (((this->Packages)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     (bVar2 = cmCPackIFWGenerator::IsOnePackage((this->super_cmCPackIFWCommon).Generator), bVar2)) {
    cmCPackIFWPackage::cmCPackIFWPackage(&local_2e8);
    local_2e8.super_cmCPackIFWCommon.Generator = (this->super_cmCPackIFWCommon).Generator;
    paVar1 = &local_368.field_2;
    local_368._M_dataplus._M_p = (pointer)paVar1;
    local_2e8.Installer = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_368,"CPACK_IFW_PACKAGE_GROUP","");
    pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar1) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if (pcVar3 == (char *)0x0) {
      cmCPackIFWPackage::ConfigureFromOptions(&local_2e8);
    }
    else {
      local_368._M_dataplus._M_p = (pointer)paVar1;
      sVar4 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,pcVar3,pcVar3 + sVar4);
      cmCPackIFWPackage::ConfigureFromGroup(&local_2e8,&local_368);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != paVar1) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      sVar4 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,pcVar3,pcVar3 + sVar4);
      cmsys::SystemTools::UpperCase(&local_308,&local_328);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_308,0,(char *)0x0,0x5afcfe);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_338 = *plVar7;
        lStack_330 = plVar5[3];
        local_348 = &local_338;
      }
      else {
        local_338 = *plVar7;
        local_348 = (long *)*plVar5;
      }
      local_340 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_348);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_368.field_2._M_allocated_capacity = *psVar8;
        local_368.field_2._8_8_ = plVar5[3];
        local_368._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_368.field_2._M_allocated_capacity = *psVar8;
        local_368._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_368._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_348 != &local_338) {
        operator_delete(local_348,local_338 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_368);
      if (pcVar3 == (char *)0x0) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_2e8.ForcedInstallation,0,
                   (char *)local_2e8.ForcedInstallation._M_string_length,0x5cd56f);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != paVar1) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
    }
    cmCPackIFWPackage::GeneratePackageFile(&local_2e8);
    cmCPackIFWPackage::~cmCPackIFWPackage(&local_2e8);
  }
  else {
    for (p_Var6 = (this->Packages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != &(this->Packages)._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      cmCPackIFWPackage::GeneratePackageFile(*(cmCPackIFWPackage **)(p_Var6 + 2));
    }
  }
  return;
}

Assistant:

void cmCPackIFWInstaller::GeneratePackageFiles()
{
  if (this->Packages.empty() || this->Generator->IsOnePackage()) {
    // Generate default package
    cmCPackIFWPackage package;
    package.Generator = this->Generator;
    package.Installer = this;
    // Check package group
    if (const char* option = this->GetOption("CPACK_IFW_PACKAGE_GROUP")) {
      package.ConfigureFromGroup(option);
      std::string forcedOption = "CPACK_IFW_COMPONENT_GROUP_" +
        cmsys::SystemTools::UpperCase(option) + "_FORCED_INSTALLATION";
      if (!GetOption(forcedOption)) {
        package.ForcedInstallation = "true";
      }
    } else {
      package.ConfigureFromOptions();
    }
    package.GeneratePackageFile();
    return;
  }

  // Generate packages meta information
  for (PackagesMap::iterator pit = this->Packages.begin();
       pit != this->Packages.end(); ++pit) {
    cmCPackIFWPackage* package = pit->second;
    package->GeneratePackageFile();
  }
}